

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O2

void __thiscall cornerstone::raft_server::handle_prevote_resp(raft_server *this,resp_msg *resp)

{
  prevote_state *ppVar1;
  element_type *peVar2;
  bool bVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  shared_lock<std::shared_timed_mutex> rlock;
  allocator<char> local_b9;
  string local_b8 [32];
  shared_lock<std::shared_timed_mutex> local_98;
  strfmt<100> local_88;
  
  if ((this->prevote_state_)._M_t.
      super___uniq_ptr_impl<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
      ._M_t.
      super__Tuple_impl<0UL,_cornerstone::prevote_state_*,_std::default_delete<cornerstone::prevote_state>_>
      .super__Head_base<0UL,_cornerstone::prevote_state_*,_false>._M_head_impl ==
      (prevote_state *)0x0) {
    peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_88.fmt_ = "Prevote has completed, term received: %llu, current term %llu";
    pcVar4 = strfmt<100>::fmt<unsigned_long,unsigned_long>
                       (&local_88,(resp->super_msg_base).term_,
                        ((this->state_).
                         super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->term_);
    std::__cxx11::string::string<std::allocator<char>>(local_b8,pcVar4,(allocator<char> *)&local_98)
    ;
    (*peVar2->_vptr_logger[3])(peVar2,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  else {
    local_98._M_pm = &this->peers_lock_;
    local_98._M_owns = true;
    std::__shared_mutex_pthread::lock_shared(&(local_98._M_pm)->super___shared_timed_mutex_base);
    bVar3 = prevote_state::add_voted_server
                      ((this->prevote_state_)._M_t.
                       super___uniq_ptr_impl<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cornerstone::prevote_state_*,_std::default_delete<cornerstone::prevote_state>_>
                       .super__Head_base<0UL,_cornerstone::prevote_state_*,_false>._M_head_impl,
                       (resp->super_msg_base).src_);
    if (bVar3) {
      ppVar1 = (this->prevote_state_)._M_t.
               super___uniq_ptr_impl<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
               ._M_t.
               super__Tuple_impl<0UL,_cornerstone::prevote_state_*,_std::default_delete<cornerstone::prevote_state>_>
               .super__Head_base<0UL,_cornerstone::prevote_state_*,_false>._M_head_impl;
      iVar5 = ppVar1->accepted_votes_;
      if (resp->accepted_ == true) {
        iVar5 = iVar5 + 1;
        ppVar1->accepted_votes_ = iVar5;
      }
      uVar6 = (this->peers_)._M_h._M_element_count + 1;
      if ((int)(uVar6 >> 1) < iVar5) {
        peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_88.fmt_ = "Prevote passed for term %llu";
        pcVar4 = strfmt<100>::fmt<unsigned_long>
                           (&local_88,
                            ((this->state_).
                             super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->term_);
        std::__cxx11::string::string<std::allocator<char>>(local_b8,pcVar4,&local_b9);
        (*peVar2->_vptr_logger[3])(peVar2,local_b8);
        std::__cxx11::string::~string(local_b8);
        become_candidate(this);
      }
      else if (uVar6 <= (ppVar1->voted_servers_)._M_h._M_element_count) {
        peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_88.fmt_ = "Prevote failed for term %llu";
        pcVar4 = strfmt<100>::fmt<unsigned_long>
                           (&local_88,
                            ((this->state_).
                             super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->term_);
        std::__cxx11::string::string<std::allocator<char>>(local_b8,pcVar4,&local_b9);
        (*peVar2->_vptr_logger[3])(peVar2,local_b8);
        std::__cxx11::string::~string(local_b8);
        prevote_state::reset
                  ((this->prevote_state_)._M_t.
                   super___uniq_ptr_impl<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cornerstone::prevote_state_*,_std::default_delete<cornerstone::prevote_state>_>
                   .super__Head_base<0UL,_cornerstone::prevote_state_*,_false>._M_head_impl);
        restart_election_timer(this);
      }
    }
    else {
      peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"Prevote has from %d has been processed.",
                 (allocator<char> *)local_b8);
      (*peVar2->_vptr_logger[3])(peVar2,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    std::shared_lock<std::shared_timed_mutex>::~shared_lock(&local_98);
  }
  return;
}

Assistant:

void raft_server::handle_prevote_resp(resp_msg& resp)
{
    if (!prevote_state_)
    {
        l_->info(sstrfmt("Prevote has completed, term received: %llu, current term %llu")
                     .fmt(resp.get_term(), state_->get_term()));
        return;
    }

    {
        read_lock(peers_lock_);
        bool vote_added = prevote_state_->add_voted_server(resp.get_src());
        if (!vote_added)
        {
            l_->info("Prevote has from %d has been processed.");
            return;
        }

        if (resp.get_accepted())
        {
            prevote_state_->inc_accepted_votes();
        }

        if (prevote_state_->get_accepted_votes() > (int32)((peers_.size() + 1) / 2))
        {
            l_->info(sstrfmt("Prevote passed for term %llu").fmt(state_->get_term()));
            become_candidate();
        }
        else if (prevote_state_->num_of_votes() >= (peers_.size() + 1))
        {
            l_->info(sstrfmt("Prevote failed for term %llu").fmt(state_->get_term()));
            prevote_state_->reset();  // still in prevote state, just reset the prevote state
            restart_election_timer(); // restart election timer for a new round of prevote
        }
    }
}